

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgData.cpp
# Opt level: O0

void __thiscall CfgData::CfgData(CfgData *this,CFG *cfg)

{
  bool bVar1;
  Type TVar2;
  int size;
  reference ppCVar3;
  set<CfgNode::Edge,_std::less<CfgNode::Edge>,_std::allocator<CfgNode::Edge>_> *this_00;
  reference e;
  Data *pDVar4;
  Addr AVar5;
  list<Instruction_*,_std::allocator<Instruction_*>_> *this_01;
  reference ppIVar6;
  set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *this_02;
  reference ppCVar7;
  pair<std::_Rb_tree_const_iterator<CfgData::Edge>,_bool> pVar8;
  pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool> pVar9;
  pair<std::_Rb_tree_const_iterator<CfgData::Call>,_bool> pVar10;
  Addr local_1c8;
  _Base_ptr local_1c0;
  undefined1 local_1b8;
  _Base_ptr local_1b0;
  undefined1 local_1a8;
  Addr local_1a0;
  CFG *local_198;
  CFG *calledCfg;
  iterator __end2_2;
  iterator __begin2_2;
  set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *__range2_2;
  Call call;
  Addr local_128;
  Instruction *local_120;
  Instruction *instr;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  list<Instruction_*,_std::allocator<Instruction_*>_> *__range2_1;
  Node local_f0;
  BlockData *local_d8;
  BlockData *block;
  undefined1 local_c8;
  Edge local_c0;
  Addr local_a8;
  Addr to;
  Edge edgeSucc;
  iterator __end2;
  iterator __begin2;
  set<CfgNode::Edge,_std::less<CfgNode::Edge>,_std::allocator<CfgNode::Edge>_> *__range2;
  Addr local_68;
  Addr from;
  CfgNode *node;
  iterator __end1;
  iterator __begin1;
  list<CfgNode_*,_std::allocator<CfgNode_*>_> local_38;
  list<CfgNode_*,_std::allocator<CfgNode_*>_> *local_20;
  list<CfgNode_*,_std::allocator<CfgNode_*>_> *__range1;
  CFG *cfg_local;
  CfgData *this_local;
  
  this->_vptr_CfgData = (_func_int **)&PTR__CfgData_0013bae0;
  __range1 = (list<CfgNode_*,_std::allocator<CfgNode_*>_> *)cfg;
  cfg_local = (CFG *)this;
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            (&this->m_instrs);
  std::set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_>::set
            (&this->m_blocks);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            (&this->m_phantoms);
  std::set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>::set
            (&this->m_edges);
  std::set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>::set
            (&this->m_calls);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            (&this->m_indirects);
  CFG::nodes_abi_cxx11_(&local_38,(CFG *)__range1);
  local_20 = &local_38;
  __end1 = std::__cxx11::list<CfgNode_*,_std::allocator<CfgNode_*>_>::begin(local_20);
  node = (CfgNode *)std::__cxx11::list<CfgNode_*,_std::allocator<CfgNode_*>_>::end(local_20);
  do {
    bVar1 = std::operator!=(&__end1,(_Self *)&node);
    if (!bVar1) {
      std::__cxx11::list<CfgNode_*,_std::allocator<CfgNode_*>_>::~list(&local_38);
      return;
    }
    ppCVar3 = std::_List_iterator<CfgNode_*>::operator*(&__end1);
    from = (Addr)*ppCVar3;
    local_68 = CfgNode::node2addr((CfgNode *)from);
    TVar2 = CfgNode::type((CfgNode *)from);
    if (TVar2 == CFG_PHANTOM) {
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
                (&this->m_phantoms,&local_68);
    }
    else {
      this_00 = CfgNode::successors((CfgNode *)from);
      __end2 = std::set<CfgNode::Edge,_std::less<CfgNode::Edge>,_std::allocator<CfgNode::Edge>_>::
               begin(this_00);
      edgeSucc.node =
           (CfgNode *)
           std::set<CfgNode::Edge,_std::less<CfgNode::Edge>,_std::allocator<CfgNode::Edge>_>::end
                     (this_00);
      while (bVar1 = std::operator!=(&__end2,(_Self *)&edgeSucc.node), bVar1) {
        e = std::_Rb_tree_const_iterator<CfgNode::Edge>::operator*(&__end2);
        CfgNode::Edge::Edge((Edge *)&to,e);
        local_a8 = CfgNode::node2addr((CfgNode *)edgeSucc._vptr_Edge);
        Edge::Edge(&local_c0,local_68,local_a8);
        pVar8 = std::set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>::
                insert(&this->m_edges,&local_c0);
        block = (BlockData *)pVar8.first._M_node;
        local_c8 = pVar8.second;
        Edge::~Edge(&local_c0);
        CfgNode::Edge::~Edge((Edge *)&to);
        std::_Rb_tree_const_iterator<CfgNode::Edge>::operator++(&__end2);
      }
      TVar2 = CfgNode::type((CfgNode *)from);
      if (TVar2 == CFG_BLOCK) {
        pDVar4 = CfgNode::data((CfgNode *)from);
        if (pDVar4 == (Data *)0x0) {
          __assert_fail("node->data() != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CfgData.cpp"
                        ,0x2f,"CfgData::CfgData(CFG *)");
        }
        local_d8 = (BlockData *)CfgNode::data((CfgNode *)from);
        AVar5 = CfgNode::Data::addr((Data *)local_d8);
        size = CfgNode::BlockData::size(local_d8);
        Node::Node(&local_f0,AVar5,size);
        std::set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_>::insert
                  (&this->m_blocks,&local_f0);
        Node::~Node(&local_f0);
        this_01 = CfgNode::BlockData::instructions_abi_cxx11_(local_d8);
        __end2_1 = std::__cxx11::list<Instruction_*,_std::allocator<Instruction_*>_>::begin(this_01)
        ;
        instr = (Instruction *)
                std::__cxx11::list<Instruction_*,_std::allocator<Instruction_*>_>::end(this_01);
        while (bVar1 = std::operator!=(&__end2_1,(_Self *)&instr), bVar1) {
          ppIVar6 = std::_List_const_iterator<Instruction_*>::operator*(&__end2_1);
          local_120 = *ppIVar6;
          local_128 = Instruction::addr(local_120);
          pVar9 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                  ::insert(&this->m_instrs,&local_128);
          call.calls._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pVar9.first._M_node;
          std::_List_const_iterator<Instruction_*>::operator++(&__end2_1);
        }
        AVar5 = CfgNode::Data::addr(&local_d8->super_Data);
        Call::Call((Call *)&__range2_2,AVar5);
        this_02 = CfgNode::BlockData::calls(local_d8);
        __end2_2 = std::set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_>::begin(this_02);
        calledCfg = (CFG *)std::set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_>::end(this_02);
        while (bVar1 = std::operator!=(&__end2_2,(_Self *)&calledCfg), bVar1) {
          ppCVar7 = std::_Rb_tree_const_iterator<CFG_*>::operator*(&__end2_2);
          local_198 = *ppCVar7;
          local_1a0 = CFG::addr(local_198);
          pVar9 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                  ::insert((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                            *)&call.block_addr,&local_1a0);
          local_1b0 = (_Base_ptr)pVar9.first._M_node;
          local_1a8 = pVar9.second;
          std::_Rb_tree_const_iterator<CFG_*>::operator++(&__end2_2);
        }
        bVar1 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                empty((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)&call.block_addr);
        if (!bVar1) {
          pVar10 = std::set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>
                   ::insert(&this->m_calls,(value_type *)&__range2_2);
          local_1c0 = (_Base_ptr)pVar10.first._M_node;
          local_1b8 = pVar10.second;
        }
        bVar1 = CfgNode::BlockData::isIndirect(local_d8);
        if (bVar1) {
          local_1c8 = CfgNode::Data::addr(&local_d8->super_Data);
          std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
                    (&this->m_indirects,&local_1c8);
        }
        Call::~Call((Call *)&__range2_2);
      }
    }
    std::_List_iterator<CfgNode_*>::operator++(&__end1);
  } while( true );
}

Assistant:

CfgData::CfgData(CFG* cfg) {
	for (CfgNode* node : cfg->nodes()) {
		Addr from = CfgNode::node2addr(node);

		if (node->type() == CfgNode::CFG_PHANTOM) {
			m_phantoms.insert(from);
			continue;
		}

		for (CfgNode::Edge edgeSucc : node->successors()) {
			Addr to = CfgNode::node2addr(edgeSucc.node);
			m_edges.insert(CfgData::Edge(from, to));
		}

		if (node->type() != CfgNode::CFG_BLOCK)
			continue;

		assert(node->data() != 0);
		CfgNode::BlockData* block = static_cast<CfgNode::BlockData*>(node->data());
		m_blocks.insert(CfgData::Node(block->addr(), block->size()));

		for (Instruction* instr : block->instructions())
			m_instrs.insert(instr->addr());

		CfgData::Call call(block->addr());
		for (CFG* calledCfg : block->calls()) {
			call.calls.insert(calledCfg->addr());
		}

		if (!call.calls.empty())
			m_calls.insert(call);

		if (block->isIndirect())
			m_indirects.insert(block->addr());
	}
}